

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseMemoryBinaryExpr<wabt::MemoryBinaryExpr<(wabt::ExprType)28>>
          (WastParser *this,Location loc,
          unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  Expr *pEVar1;
  Location loc_00;
  Location loc_01;
  Result RVar2;
  MemoryBinaryExpr<(wabt::ExprType)28> *this_00;
  Enum EVar3;
  Var destmemidx;
  Var srcmemidx;
  Var local_c0;
  Var local_78;
  
  Var::Var(&srcmemidx);
  Var::Var(&destmemidx);
  loc_00.filename._M_str = loc.filename._M_str;
  loc_00.filename._M_len = loc.filename._M_len;
  loc_00.field_1.field_1.offset = loc.field_1.field_1.offset;
  loc_00.field_1._8_8_ = loc.field_1._8_8_;
  RVar2 = ParseMemidx(this,loc_00,&srcmemidx);
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    loc_01.filename._M_str = loc.filename._M_str;
    loc_01.filename._M_len = loc.filename._M_len;
    loc_01.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_01.field_1._8_8_ = loc.field_1._8_8_;
    RVar2 = ParseMemidx(this,loc_01,&destmemidx);
    if (RVar2.enum_ != Error) {
      this_00 = (MemoryBinaryExpr<(wabt::ExprType)28> *)operator_new(0xd0);
      Var::Var(&local_78,&srcmemidx);
      Var::Var(&local_c0,&destmemidx);
      MemoryBinaryExpr<(wabt::ExprType)28>::MemoryBinaryExpr(this_00,&local_78,&local_c0,&loc);
      pEVar1 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
               _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
               super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
      (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
      super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
      super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)this_00;
      if (pEVar1 != (Expr *)0x0) {
        (*pEVar1->_vptr_Expr[1])();
      }
      Var::~Var(&local_c0);
      Var::~Var(&local_78);
      EVar3 = Ok;
    }
  }
  Var::~Var(&destmemidx);
  Var::~Var(&srcmemidx);
  return (Result)EVar3;
}

Assistant:

Result WastParser::ParseMemoryBinaryExpr(Location loc,
                                         std::unique_ptr<Expr>* out_expr) {
  Var srcmemidx;
  Var destmemidx;
  CHECK_RESULT(ParseMemidx(loc, &srcmemidx));
  CHECK_RESULT(ParseMemidx(loc, &destmemidx));
  out_expr->reset(new T(srcmemidx, destmemidx, loc));
  return Result::Ok;
}